

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
OP_LdArrWasmFunc<Js::OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout)

{
  uint index_00;
  uint32 uVar1;
  void *aValue;
  WebAssemblyTable *this_00;
  ScriptContext *pSVar2;
  Var val;
  Var func;
  uint32 index;
  WebAssemblyTable *table;
  OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout_local;
  InterpreterStackFrame *this_local;
  
  aValue = GetRegRawPtr<unsigned_short>(this,playout->Instance);
  this_00 = VarTo<Js::WebAssemblyTable>(aValue);
  index_00 = GetRegRawInt<unsigned_short>(this,playout->SlotIndex);
  uVar1 = WebAssemblyTable::GetCurrentLength(this_00);
  if (uVar1 <= index_00) {
    pSVar2 = GetScriptContext(this);
    JavascriptError::ThrowWebAssemblyRuntimeError(pSVar2,-0x7ff5e498,(PCWSTR)0x0);
  }
  val = WebAssemblyTable::DirectGetValue(this_00,index_00);
  if (val == (Var)0x0) {
    pSVar2 = GetScriptContext(this);
    JavascriptError::ThrowWebAssemblyRuntimeError(pSVar2,-0x7ff5e49b,(PCWSTR)0x0);
  }
  SetRegRawPtr<unsigned_short>(this,playout->Value,val);
  return;
}

Assistant:

void InterpreterStackFrame::OP_LdArrWasmFunc(const unaligned T* playout)
    {
#ifdef ENABLE_WASM
        WebAssemblyTable * table = VarTo<WebAssemblyTable>(GetRegRawPtr(playout->Instance));
        const uint32 index = (uint32)GetRegRawInt(playout->SlotIndex);
        if (index >= table->GetCurrentLength())
        {
            JavascriptError::ThrowWebAssemblyRuntimeError(GetScriptContext(), WASMERR_TableIndexOutOfRange);
        }
        Var func = table->DirectGetValue(index);
        if (!func)
        {
            JavascriptError::ThrowWebAssemblyRuntimeError(GetScriptContext(), WASMERR_NeedWebAssemblyFunc);
        }
        SetRegRawPtr(playout->Value, func);
#endif
    }